

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  Parse *pPVar1;
  ExprList *pEVar2;
  char *pcVar3;
  SrcList *pSVar4;
  Expr *pExpr;
  int iVar5;
  RenameToken *pRVar6;
  long lVar7;
  long lVar8;
  
  pPVar1 = pWalker->pParse;
  iVar5 = 2;
  if ((pPVar1->nErr == 0) && (iVar5 = 1, (p->selFlags & 0x4200000) == 0)) {
    pEVar2 = p->pEList;
    if ((pEVar2 != (ExprList *)0x0) && (iVar5 = pEVar2->nExpr, 0 < (long)iVar5)) {
      lVar8 = 0;
      do {
        pcVar3 = pEVar2->a[lVar8].zEName;
        if ((pcVar3 != (char *)0x0) && ((pEVar2->a[lVar8].fg.field_0x1 & 3) == 0)) {
          for (pRVar6 = pPVar1->pRename; pRVar6 != (RenameToken *)0x0; pRVar6 = pRVar6->pNext) {
            if ((char *)pRVar6->p == pcVar3) {
              pRVar6->p = (void *)0x0;
              break;
            }
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar5);
    }
    pSVar4 = p->pSrc;
    if ((pSVar4 != (SrcList *)0x0) && (0 < pSVar4->nSrc)) {
      lVar8 = 0;
      do {
        pRVar6 = pPVar1->pRename;
        if (pRVar6 != (RenameToken *)0x0) {
          do {
            if ((char *)pRVar6->p == pSVar4->a[lVar8].zName) {
              pRVar6->p = (void *)0x0;
              break;
            }
            pRVar6 = pRVar6->pNext;
          } while (pRVar6 != (RenameToken *)0x0);
        }
        pExpr = (Expr *)pSVar4->a[lVar8].u3.pUsing;
        if ((pSVar4->a[lVar8].fg.field_0x2 & 4) == 0) {
          if (pExpr != (Expr *)0x0) {
            walkExpr(pWalker,pExpr);
          }
        }
        else {
          iVar5._0_1_ = pExpr->op;
          iVar5._1_1_ = pExpr->affExpr;
          iVar5._2_1_ = pExpr->op2;
          iVar5._3_1_ = pExpr->field_0x3;
          if (0 < (long)iVar5) {
            lVar7 = 0;
            do {
              pRVar6 = pPVar1->pRename;
              if (pRVar6 != (RenameToken *)0x0) {
                do {
                  if ((char *)pRVar6->p == (&pExpr->u)[lVar7 * 2].zToken) {
                    pRVar6->p = (void *)0x0;
                    break;
                  }
                  pRVar6 = pRVar6->pNext;
                } while (pRVar6 != (RenameToken *)0x0);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != iVar5);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pSVar4->nSrc);
    }
    renameWalkWith(pWalker,p);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( pParse->nErr ) return WRC_Abort;
  testcase( p->selFlags & SF_View );
  testcase( p->selFlags & SF_CopyCte );
  if( p->selFlags & (SF_View|SF_CopyCte) ){
    return WRC_Prune;
  }
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zEName && pList->a[i].fg.eEName==ENAME_NAME ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zEName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
      if( pSrc->a[i].fg.isUsing==0 ){
        sqlite3WalkExpr(pWalker, pSrc->a[i].u3.pOn);
      }else{
        unmapColumnIdlistNames(pParse, pSrc->a[i].u3.pUsing);
      }
    }
  }

  renameWalkWith(pWalker, p);
  return WRC_Continue;
}